

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_CodeAuthenticator.cpp
# Opt level: O2

bool __thiscall axl::sys::CodeAuthenticator::verifyFile(CodeAuthenticator *this,StringRef *fileName)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_a0;
  Block signatureSection;
  uchar_t hash [20];
  SimpleMappedFile file;
  
  file.m_file.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  file.m_mapping.m_mapping.m_p = (void *)0x0;
  file.m_mapping.m_mapping.m_size = 0;
  file.m_mapping.m_sharedMemory.super_File.
  super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  file.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p
       = (C *)0x0;
  file.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
  m_hdr._0_1_ = 0;
  file.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
  m_hdr._1_7_ = 0;
  file.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
  m_length._0_1_ = 0;
  file.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
  _17_8_ = 0;
  file.m_mapping.m_p = (void *)0x0;
  file.m_mapping.m_size = 0;
  file.m_openFlags = 0;
  signatureSection.m_p = (void *)0x0;
  signatureSection.m_size = 0;
  iVar2 = io::SimpleMappedFile::open(&file,(char *)fileName,1);
  if ((char)iVar2 != '\0') {
    bVar1 = lnx::ElfHashGenerator::generateHash
                      (&this->super_ElfHashGenerator,file.m_mapping.m_p,file.m_mapping.m_size,hash,
                       &signatureSection);
    if (bVar1) {
      if (signatureSection.m_p == (void *)0x0) {
        err::ErrorRef::ErrorRef((ErrorRef *)&local_a0,"ELF-file signature not found");
        err::setError((ErrorRef *)&local_a0);
      }
      else {
        bVar1 = cry::Rsa::verifyHash
                          (&this->m_publicKey,0x40,hash,0x14,signatureSection.m_p,
                           signatureSection.m_size);
        bVar3 = true;
        if (bVar1) goto LAB_0012370a;
        err::ErrorRef::ErrorRef((ErrorRef *)&local_a0,"ELF-file signature mismatch");
        err::setError((ErrorRef *)&local_a0);
      }
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_a0);
    }
  }
  bVar3 = false;
LAB_0012370a:
  io::SimpleMappedFile::~SimpleMappedFile(&file);
  return bVar3;
}

Assistant:

bool
CodeAuthenticator::verifyFile(const sl::StringRef& fileName) {
	io::SimpleMappedFile file;
	uchar_t hash[SHA_DIGEST_LENGTH];
	mem::Block signatureSection;

	bool result =
		file.open(fileName, io::FileFlag_ReadOnly) &&
		generateHash(file.p(), file.getMappingSize(), hash, &signatureSection);

	if (!result)
		return false;

	if (!signatureSection.m_p)
		return err::fail("ELF-file signature not found");

	result = m_publicKey.verifyHash(
		NID_sha1,
		hash,
		sizeof(hash),
		signatureSection.m_p,
		signatureSection.m_size
	);

	if (!result)
		return err::fail("ELF-file signature mismatch");

	return true;
}